

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O1

void do_repeat_this_on_new_proc(Am_Object *cmd)

{
  Am_Handler_Selective_Repeat_New_Method_Type *pAVar1;
  bool bVar2;
  Am_Value *value;
  anon_union_8_8_ea4c8939_for_value in_R9;
  Am_Value AVar3;
  Am_Value AVar4;
  Am_Object undo_handler;
  Am_Object command_to_undo;
  Am_Value cur_sel;
  Am_Object new_cmd;
  Am_Handler_Selective_Repeat_New_Method method;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Value local_68;
  Am_Value local_58;
  Am_Value local_48;
  Am_Object local_38;
  Am_Object local_30;
  Am_Handler_Selective_Repeat_New_Method local_28;
  
  Am_Object::Am_Object(&local_30,cmd);
  get_command_to_undo(&local_70);
  Am_Object::~Am_Object(&local_30);
  Am_Object::Am_Object(&local_78,cmd);
  get_undo_handler(&local_a0);
  Am_Object::~Am_Object(&local_78);
  bVar2 = Am_Object::Valid(&local_70);
  if (bVar2) {
    local_68.type = 0;
    local_68.value.wrapper_value = (Am_Wrapper *)0x0;
    Am_Object::Am_Object(&local_80,cmd);
    get_current_sel(&local_80,&local_68);
    Am_Object::~Am_Object(&local_80);
    local_28.from_wrapper = (Am_Method_Wrapper *)0x0;
    local_28.Call = (Am_Handler_Selective_Repeat_New_Method_Type *)0x0;
    value = Am_Object::Get(&local_a0,0x14a,0);
    Am_Handler_Selective_Repeat_New_Method::operator=(&local_28,value);
    pAVar1 = local_28.Call;
    Am_Object::Am_Object(&local_88,&local_a0);
    Am_Object::Am_Object(&local_90,&local_70);
    Am_Value::Am_Value(&local_48,&local_68);
    Am_Value::Am_Value(&local_58,&Am_No_Value);
    AVar3.value.wrapper_value = (Am_Wrapper *)&local_48;
    AVar3._0_8_ = &local_90;
    AVar4.value.wrapper_value = in_R9.wrapper_value;
    AVar4._0_8_ = &local_58;
    (*pAVar1)((Am_Object_Data *)&local_38,(Am_Object_Data *)&local_88,AVar3,AVar4);
    Am_Value::~Am_Value(&local_58);
    Am_Value::~Am_Value(&local_48);
    Am_Object::~Am_Object(&local_90);
    Am_Object::~Am_Object(&local_88);
    Am_Object::~Am_Object(&local_38);
    Am_Value::~Am_Value(&local_68);
  }
  Am_Object::Am_Object(&local_98,cmd);
  mark_changed_command_to_undo(&local_98);
  Am_Object::~Am_Object(&local_98);
  Am_Object::~Am_Object(&local_a0);
  Am_Object::~Am_Object(&local_70);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_repeat_this_on_new, (Am_Object cmd))
{
  Am_Object command_to_undo = get_command_to_undo(cmd);
  Am_Object undo_handler = get_undo_handler(cmd);
  if (command_to_undo.Valid()) {
    Am_Value cur_sel;
    get_current_sel(cmd, cur_sel);
    Am_Handler_Selective_Repeat_New_Method method;
    method = undo_handler.Get(Am_SELECTIVE_REPEAT_ON_NEW_METHOD);
    Am_Object new_cmd =
        method.Call(undo_handler, command_to_undo, cur_sel, Am_No_Value);
  }
  mark_changed_command_to_undo(cmd);
}